

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_map_field.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::javanano::(anonymous_namespace)::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Params *params,
          FieldDescriptor *field,bool boxed)

{
  char cVar1;
  JavaType JVar2;
  Params *params_00;
  LogMessage *other;
  JavaType type;
  LogFinisher local_59;
  LogMessage local_58;
  
  cVar1 = (char)field;
  JVar2 = GetJavaType((FieldDescriptor *)params);
  if (JVar2 < JAVATYPE_MESSAGE) {
    if (cVar1 == '\0') {
      PrimitiveTypeName_abi_cxx11_(__return_storage_ptr__,(javanano *)(ulong)JVar2,type);
    }
    else {
      BoxedPrimitiveTypeName_abi_cxx11_(__return_storage_ptr__,(javanano *)(ulong)JVar2,type);
    }
  }
  else if (JVar2 == JAVATYPE_MESSAGE) {
    params_00 = (Params *)FieldDescriptor::message_type((FieldDescriptor *)params);
    ClassName_abi_cxx11_(__return_storage_ptr__,(javanano *)this,params_00,(Descriptor *)field);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_map_field.cc"
               ,0x44);
    other = internal::LogMessage::operator<<(&local_58,"should not reach here.");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

string TypeName(const Params& params, const FieldDescriptor* field,
                bool boxed) {
  JavaType java_type = GetJavaType(field);
  switch (java_type) {
    case JAVATYPE_MESSAGE:
      return ClassName(params, field->message_type());
    case JAVATYPE_INT:
    case JAVATYPE_LONG:
    case JAVATYPE_FLOAT:
    case JAVATYPE_DOUBLE:
    case JAVATYPE_BOOLEAN:
    case JAVATYPE_STRING:
    case JAVATYPE_BYTES:
    case JAVATYPE_ENUM:
      if (boxed) {
        return BoxedPrimitiveTypeName(java_type);
      } else {
        return PrimitiveTypeName(java_type);
      }
    // No default because we want the compiler to complain if any new JavaTypes
    // are added..
  }

  GOOGLE_LOG(FATAL) << "should not reach here.";
  return "";
}